

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void labelcolor_cb(Fl_Button *i,void *v)

{
  bool bVar1;
  Fl_Color FVar2;
  int iVar3;
  Fl_Color FVar4;
  Fl_Color bg;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  
  FVar4 = (current_widget->o->label_).color;
  bg = FVar4;
  if ((char *)v != "LOAD") {
    FVar2 = fl_show_colormap(FVar4);
    if ((FVar2 != FVar4) && (bg = FVar2, Fl_Type::first != (Fl_Type *)0x0)) {
      bVar1 = false;
      this = (Fl_Widget_Type *)Fl_Type::first;
      do {
        if (((this->super_Fl_Type).selected != '\0') &&
           (iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar3 != 0)) {
          (this->o->label_).color = FVar2;
          Fl_Widget_Type::redraw(this);
          bVar1 = true;
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (bVar1) {
        set_modflag(1);
      }
    }
    if (FVar2 == FVar4) {
      return;
    }
  }
  (i->super_Fl_Widget).color_ = bg;
  FVar4 = fl_contrast(0x38,bg);
  (i->super_Fl_Widget).label_.color = FVar4;
  Fl_Widget::redraw(&i->super_Fl_Widget);
  return;
}

Assistant:

void labelcolor_cb(Fl_Button* i, void *v) {
  Fl_Color c = current_widget->o->labelcolor();
  if (v != LOAD) {
    int mod = 0;
    Fl_Color d = fl_show_colormap(c);
    if (d == c) return;
    c = d;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelcolor(c); q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->color(c); i->labelcolor(fl_contrast(FL_BLACK,c)); i->redraw();
}